

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::InitializeStackFunctions
          (InterpreterStackFrame *this,StackScriptFunction *scriptFunctions)

{
  ParseableFunctionInfo *this_00;
  NestedArray *pNVar1;
  FunctionProxy *this_01;
  ScriptFunctionType *type;
  ulong uVar2;
  ulong uVar3;
  
  *(StackScriptFunction **)(this + 0x48) = scriptFunctions;
  this_00 = *(ParseableFunctionInfo **)(this + 0x88);
  pNVar1 = (this_00->nestedArray).ptr;
  if ((pNVar1 != (NestedArray *)0x0) && (uVar2 = (ulong)pNVar1->nestedCount, uVar2 != 0)) {
    uVar3 = 0;
    do {
      this_01 = ParseableFunctionInfo::GetNestedFunctionProxy(this_00,(uint)uVar3);
      type = FunctionProxy::EnsureDeferredPrototypeType(this_01);
      ScriptFunction::ScriptFunction(&scriptFunctions->super_ScriptFunction,this_01,type);
      (scriptFunctions->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
      super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           (_func_int **)&PTR_Finalize_01536968;
      scriptFunctions->boxedScriptFunction = (ScriptFunction *)0x0;
      uVar3 = uVar3 + 1;
      scriptFunctions = scriptFunctions + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void InterpreterStackFrame::InitializeStackFunctions(StackScriptFunction * scriptFunctions)
    {
        this->stackNestedFunctions = scriptFunctions;
        FunctionBody * functionBody = this->m_functionBody;
        uint nestedCount = functionBody->GetNestedCount();
        for (uint i = 0; i < nestedCount; i++)
        {
            StackScriptFunction * stackScriptFunction = scriptFunctions + i;
            FunctionProxy* nestedProxy = functionBody->GetNestedFunctionProxy(i);
            ScriptFunctionType* type = nestedProxy->EnsureDeferredPrototypeType();
            new (stackScriptFunction)StackScriptFunction(nestedProxy, type);
        }
    }